

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GLSL420Pack::InitializerListNegativeTest::prepareNextTestCase
          (InitializerListNegativeTest *this,GLuint test_case_index)

{
  size_type sVar1;
  GLuint test_case_index_local;
  InitializerListNegativeTest *this_local;
  
  this->m_current_test_case_index = test_case_index;
  if (test_case_index == 0xffffffff) {
    this->m_current_test_case_index = 0;
    this_local._7_1_ = true;
  }
  else {
    sVar1 = std::
            vector<gl4cts::GLSL420Pack::InitializerListNegativeTest::TESTED_ERRORS,_std::allocator<gl4cts::GLSL420Pack::InitializerListNegativeTest::TESTED_ERRORS>_>
            ::size(&this->m_test_cases);
    if (test_case_index < sVar1) {
      logTestCaseName(this);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool InitializerListNegativeTest::prepareNextTestCase(glw::GLuint test_case_index)
{
	m_current_test_case_index = test_case_index;

	if ((glw::GLuint)-1 == test_case_index)
	{
		m_current_test_case_index = 0;
		return true;
	}
	else if (m_test_cases.size() <= test_case_index)
	{
		return false;
	}

	logTestCaseName();

	return true;
}